

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall czh::node::Node::Node(Node *this,Node *node)

{
  bool bVar1;
  NodeData *pNVar2;
  reference pNVar3;
  Node *r;
  iterator __end3;
  iterator __begin3;
  list<czh::node::Node,_std::allocator<czh::node::Node>_> *__range3;
  NodeData *nd;
  Node *node_local;
  Node *this_local;
  
  std::__cxx11::string::string((string *)this,&node->name);
  this->last_node = node->last_node;
  std::variant<czh::node::Node::NodeData,_czh::value::Value>::variant(&this->data,&node->data);
  czh::token::Token::Token(&this->czh_token,&node->czh_token);
  bVar1 = is_node(this);
  if (bVar1) {
    pNVar2 = std::get<czh::node::Node::NodeData,czh::node::Node::NodeData,czh::value::Value>
                       (&this->data);
    __end3 = std::__cxx11::list<czh::node::Node,_std::allocator<czh::node::Node>_>::begin
                       (&pNVar2->nodes);
    r = (Node *)std::__cxx11::list<czh::node::Node,_std::allocator<czh::node::Node>_>::end
                          (&pNVar2->nodes);
    while (bVar1 = std::operator==(&__end3,(_Self *)&r), ((bVar1 ^ 0xffU) & 1) != 0) {
      pNVar3 = std::_List_iterator<czh::node::Node>::operator*(&__end3);
      pNVar3->last_node = this;
      std::_List_iterator<czh::node::Node>::operator++(&__end3);
    }
  }
  return;
}

Assistant:

Node(Node &&node)
        : name(std::move(node.name)), last_node(std::move(node.last_node)), czh_token(std::move(node.czh_token)),
          data(std::move(node.data))
    {
      if (is_node())
      {
        auto &nd = std::get<NodeData>(data);
        for (auto &r: nd.nodes)
        {
          r.last_node = this;
        }
      }
    }